

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  ImageInverter *__p;
  _Rb_tree_header *p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  size_t sVar8;
  undefined8 extraout_RAX;
  long *plVar9;
  ostream *poVar10;
  char *pcVar11;
  undefined8 in_RCX;
  int extraout_EDX;
  bool bVar12;
  QPDF qpdf;
  QPDFObjectHandle bits_per_component;
  QPDFWriter w;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  QPDF local_150 [12];
  undefined4 local_144;
  char *local_140;
  long *local_138 [2];
  long local_128 [2];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_118;
  QPDFObjectHandle local_108;
  long *local_f8 [2];
  long local_e8 [2];
  string local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [8];
  _Rb_tree_node_base local_c0;
  ImageInverter *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  char *local_88;
  long local_80;
  long local_78;
  ImageInverter *local_70;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc < 2) || (iVar4 = strcmp(argv[1]," --static-id"), iVar4 != 0)) {
    local_144 = 0;
  }
  else {
    argv = argv + 1;
    argc = argc + -1;
    local_144 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  }
  if (1 < argc - 3U) {
    usage();
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    QPDF::~QPDF(local_150);
    if (extraout_EDX == 1) {
      plVar9 = (long *)__cxa_begin_catch(extraout_RAX);
      poVar10 = std::operator<<((ostream *)&std::cerr,whoami);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," processing file ",0x11);
      poVar10 = std::operator<<(poVar10,local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      pcVar11 = (char *)(**(code **)(*plVar9 + 0x10))(plVar9);
      poVar10 = std::operator<<(poVar10,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar10);
      exit(2);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pcVar11 = argv[1];
  pcVar1 = argv[2];
  local_88 = pcVar11;
  QPDF::QPDF(local_150);
  QPDF::processFile((char *)local_150,pcVar11);
  __p = (ImageInverter *)operator_new(0x40);
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider((StreamDataProvider *)__p,false);
  *(undefined ***)__p = &PTR__ImageInverter_00106c58;
  p_Var5 = &(__p->copied_images)._M_t._M_impl.super__Rb_tree_header;
  (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (__p->copied_images)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = __p;
  local_70 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImageInverter*>(&local_90,__p);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_c8,local_150);
  local_140 = pcVar1;
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_c8);
  local_80 = local_50;
  if (local_58 != local_50) {
    do {
      local_78 = local_58;
      QPDFPageObjectHelper::getImages_abi_cxx11_();
      for (p_Var7 = local_c0._M_left; p_Var7 != &local_c0;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        QPDFObjectHandle::getDict();
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/ColorSpace","");
        QPDFObjectHandle::getKey(local_68);
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/BitsPerComponent","");
        QPDFObjectHandle::getKey(local_d8);
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        cVar2 = QPDFObjectHandle::pipeStreamData
                          ((Pipeline *)(p_Var7 + 2),0,qpdf_dl_generalized,true,false);
        if (cVar2 == '\0') {
LAB_001039a6:
          bVar12 = false;
        }
        else {
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"/DeviceGray","");
          cVar3 = QPDFObjectHandle::isNameAndEquals(local_68);
          if ((cVar3 == '\0') || (cVar3 = QPDFObjectHandle::isInteger(), cVar3 == '\0'))
          goto LAB_001039a6;
          lVar6 = QPDFObjectHandle::getIntValue();
          bVar12 = lVar6 == 8;
        }
        if ((cVar2 != '\0') && (local_f8[0] != local_e8)) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        if (bVar12) {
          local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)(p_Var7 + 2);
          local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[2]._M_parent;
          if ((_Base_ptr)
              local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((_Base_ptr)
                       local_108.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_108.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&((_Base_ptr)
                       local_108.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_108.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_M_parent + 1;
            }
          }
          local_118.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = &local_98->super_StreamDataProvider;
          local_118.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_90._M_pi;
          if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
            }
          }
          ImageInverter::registerImage(local_70,&local_108,&local_118);
          if (local_118.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.
                       super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((_Base_ptr)
              local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
        }
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   *)local_c8);
      local_58 = local_78 + 0x38;
    } while (local_58 != local_80);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_58);
  QPDFWriter::QPDFWriter((QPDFWriter *)local_c8,local_150,local_140);
  if ((char)local_144 != '\0') {
    QPDFWriter::setStaticID(SUB81(local_c8,0));
  }
  QPDFWriter::write();
  pcVar11 = whoami;
  if (whoami == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
  }
  else {
    sVar8 = strlen(whoami);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,": new file written to ",0x16);
  pcVar11 = local_140;
  if (local_140 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
  }
  else {
    sVar8 = strlen(local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._0_8_);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  QPDF::~QPDF(local_150);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        auto* inv = new ImageInverter;
        auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(inv);

        // For each page...
        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all images on the page.
            for (auto& iter: page.getImages()) {
                QPDFObjectHandle& image = iter.second;
                QPDFObjectHandle image_dict = image.getDict();
                QPDFObjectHandle color_space = image_dict.getKey("/ColorSpace");
                QPDFObjectHandle bits_per_component = image_dict.getKey("/BitsPerComponent");

                // For our example, we can only work with 8-bit grayscale images that we can fully
                // decode.  Use pipeStreamData with a null pipeline to determine whether the image
                // is filterable.  Directly inspect keys to determine the image type.
                if (image.pipeStreamData(nullptr, qpdf_ef_compress, qpdf_dl_all) &&
                    color_space.isNameAndEquals("/DeviceGray") && bits_per_component.isInteger() &&
                    (bits_per_component.getIntValue() == 8)) {
                    inv->registerImage(image, p);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}